

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

void slang::ast::anon_unknown_39::unwrapResult
               (Scope *scope,optional<slang::SourceRange> range,LookupResult *result,
               bool unwrapGenericClasses)

{
  byte bVar1;
  SymbolKind SVar2;
  Scope *pSVar3;
  bool bVar4;
  DeclaredType *pDVar5;
  GenericClassDefSymbol *symbol;
  Diagnostic *pDVar6;
  Symbol *pSVar7;
  Symbol *pSVar8;
  DiagCode code;
  GenericClassDefSymbol *this;
  
  if (result->found != (Symbol *)0x0) {
    if (((((result->flags).m_bits & 2) == 0) ||
        (pDVar5 = Symbol::getDeclaredType(result->found), pDVar5 == (DeclaredType *)0x0)) ||
       ((pDVar5->field_0x3f & 0x40) == 0)) {
      checkVisibility(result->found,scope,range,result);
      this = (GenericClassDefSymbol *)result->found;
      SVar2 = (this->super_Symbol).kind;
      if (SVar2 == TypeAlias) {
        Compilation::noteReference(scope->compilation,(Symbol *)this,false);
        this = (GenericClassDefSymbol *)result->found;
      }
      else if (SVar2 == TypeParameter) {
        Compilation::noteReference(scope->compilation,(Symbol *)this,false);
        this = (GenericClassDefSymbol *)result->found[2].parentScope;
        result->found = (Symbol *)this;
        (result->flags).m_bits = (result->flags).m_bits | 8;
      }
      symbol = this;
      if (unwrapGenericClasses && (this->super_Symbol).kind == GenericClassDef) {
        symbol = (GenericClassDefSymbol *)
                 GenericClassDefSymbol::getDefaultSpecialization(this,scope);
        result->found = (Symbol *)symbol;
        if (symbol == (GenericClassDefSymbol *)0x0) {
          if (range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::SourceRange>._M_engaged != true) {
            return;
          }
          pDVar6 = LookupResult::addDiag
                             (result,scope,(DiagCode)0x1b000a,
                              range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                              super__Optional_payload_base<slang::SourceRange>._M_payload._M_value);
          Diagnostic::operator<<(pDVar6,(this->super_Symbol).name);
          return;
        }
      }
      if (range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
        bVar1 = (result->flags).m_bits;
        if ((bVar1 & 1) == 0) {
          if ((bVar1 & 2) == 0) {
            pSVar3 = (symbol->super_Symbol).parentScope;
            if (((pSVar3 != (Scope *)0x0) && (pSVar3->thisSym->kind == CompilationUnit)) &&
               (pSVar7 = getContainingPackage(scope->thisSym), pSVar7 != (Symbol *)0x0)) {
              code.subsystem = Lookup;
              code.code = 4;
              goto LAB_002ac7e2;
            }
          }
          else {
            pSVar7 = getContainingPackage(scope->thisSym);
            if ((pSVar7 != (Symbol *)0x0) &&
               (pSVar8 = getContainingPackage(&symbol->super_Symbol), pSVar8 != pSVar7)) {
              LookupResult::addDiag
                        (result,scope,(DiagCode)0xb000a,
                         range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                         super__Optional_payload_base<slang::SourceRange>._M_payload._M_value);
              return;
            }
          }
        }
        else {
          do {
            pSVar3 = (symbol->super_Symbol).parentScope;
            if (pSVar3 == (Scope *)0x0) {
              return;
            }
            symbol = (GenericClassDefSymbol *)pSVar3->thisSym;
            SVar2 = (symbol->super_Symbol).kind;
            if (SVar2 == Package) {
              return;
            }
          } while (SVar2 != AnonymousProgram);
          bVar4 = isInProgram(scope->thisSym);
          if (!bVar4) {
            code.subsystem = Lookup;
            code.code = 0xf;
LAB_002ac7e2:
            pDVar6 = LookupResult::addDiag
                               (result,scope,code,
                                range.super__Optional_base<slang::SourceRange,_true,_true>.
                                _M_payload.super__Optional_payload_base<slang::SourceRange>.
                                _M_payload._M_value);
            Diagnostic::addNote(pDVar6,(DiagCode)0x50001,result->found->location);
            return;
          }
        }
      }
    }
    else {
      if (range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
        pDVar6 = LookupResult::addDiag
                           (result,scope,(DiagCode)0x29000a,
                            range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                            super__Optional_payload_base<slang::SourceRange>._M_payload._M_value);
        Diagnostic::operator<<(pDVar6,result->found->name);
        Diagnostic::addNote(pDVar6,(DiagCode)0x50001,result->found->location);
      }
      result->found = (Symbol *)0x0;
    }
  }
  return;
}

Assistant:

void unwrapResult(const Scope& scope, std::optional<SourceRange> range, LookupResult& result,
                  bool unwrapGenericClasses = true) {
    if (!result.found)
        return;

    if (result.flags.has(LookupResultFlags::IsHierarchical)) {
        auto declaredType = result.found->getDeclaredType();
        if (declaredType && declaredType->isEvaluating()) {
            if (range) {
                auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *range);
                diag << result.found->name;
                diag.addNote(diag::NoteDeclarationHere, result.found->location);
            }
            result.found = nullptr;
            return;
        }
    }

    checkVisibility(*result.found, scope, range, result);

    // Unwrap type parameters into their target type alias.
    if (result.found->kind == SymbolKind::TypeParameter) {
        scope.getCompilation().noteReference(*result.found);

        result.found = &result.found->as<TypeParameterSymbol>().getTypeAlias();
        result.flags |= LookupResultFlags::FromTypeParam;
    }
    else if (result.found->kind == SymbolKind::TypeAlias) {
        scope.getCompilation().noteReference(*result.found);
    }

    // If the found symbol is a generic class, unwrap into
    // the default specialization (if possible).
    if (result.found->kind == SymbolKind::GenericClassDef && unwrapGenericClasses) {
        auto& genericClass = result.found->as<GenericClassDefSymbol>();
        result.found = genericClass.getDefaultSpecialization(scope);

        if (!result.found) {
            if (range)
                result.addDiag(scope, diag::NoDefaultSpecialization, *range) << genericClass.name;
            return;
        }
    }

    if (!range)
        return;

    if (result.flags.has(LookupResultFlags::WasImported)) {
        // If the symbol was imported from a package, check if it is actually
        // declared within an anonymous program within that package and if so,
        // check whether we're allowed to reference it from our source scope.
        auto parent = result.found->getParentScope();
        while (parent) {
            auto& parentSym = parent->asSymbol();
            if (parentSym.kind == SymbolKind::Package)
                break;

            if (parentSym.kind == SymbolKind::AnonymousProgram) {
                if (!isInProgram(scope.asSymbol())) {
                    auto& diag = result.addDiag(scope, diag::IllegalReferenceToProgramItem, *range);
                    diag.addNote(diag::NoteDeclarationHere, result.found->location);
                }
                break;
            }

            parent = parentSym.getParentScope();
        }
    }
    else if (result.flags.has(LookupResultFlags::IsHierarchical)) {
        // Hierarchical references are not allowed from within packages
        // unless the target symbol is also within the same package.
        auto pkg = getContainingPackage(scope.asSymbol());
        if (pkg && getContainingPackage(*result.found) != pkg)
            result.addDiag(scope, diag::HierarchicalFromPackage, *range);
    }
    else if (auto parent = result.found->getParentScope();
             parent && parent->asSymbol().kind == SymbolKind::CompilationUnit) {
        // Compilation unit items are not allowed to be referenced from a package.
        if (getContainingPackage(scope.asSymbol())) {
            auto& diag = result.addDiag(scope, diag::CompilationUnitFromPackage, *range);
            diag.addNote(diag::NoteDeclarationHere, result.found->location);
        }
    }
}